

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         write_significand<fmt::v8::appender,char,unsigned_long,fmt::v8::detail::digit_grouping<char>>
                   (appender out,unsigned_long significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  char cVar1;
  type tVar2;
  char *pcVar3;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> out_00;
  int in_ECX;
  undefined8 in_RDI;
  digit_grouping<char> *in_R9;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  digit_grouping<char> *in_stack_000005a0;
  basic_string_view<char> in_stack_000005a8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_000005b8;
  buffer<char> *in_stack_fffffffffffffd18;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *this;
  undefined8 in_stack_fffffffffffffd30;
  char decimal_point_00;
  undefined8 in_stack_fffffffffffffd38;
  unsigned_long in_stack_fffffffffffffd40;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffd48;
  basic_string_view<char> local_290;
  undefined8 local_280;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_278;
  allocator<char> local_251;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_250;
  undefined8 local_38;
  int local_20;
  undefined8 local_10;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  
  decimal_point_00 = (char)((ulong)in_stack_fffffffffffffd30 >> 0x38);
  local_20 = in_ECX;
  local_10 = in_RDI;
  cVar1 = digit_grouping<char>::separator(in_R9);
  if (cVar1 == '\0') {
    local_38 = local_10;
    local_8.container =
         (buffer<char> *)
         write_significand<fmt::v8::appender,_unsigned_long,_char,_0>
                   (in_stack_fffffffffffffd48.container,in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38,
                    decimal_point_00);
  }
  else {
    std::allocator<char>::allocator();
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::basic_memory_buffer
              (in_stack_fffffffffffffd20,(allocator<char> *)in_stack_fffffffffffffd18);
    std::allocator<char>::~allocator(&local_251);
    appender::back_insert_iterator((appender *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    local_278.container =
         (buffer<char> *)
         write_significand<fmt::v8::appender,_unsigned_long,_char,_0>
                   (in_stack_fffffffffffffd48.container,in_stack_fffffffffffffd40,
                    (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(int)in_stack_fffffffffffffd38,
                    decimal_point_00);
    local_280 = local_10;
    pcVar3 = buffer<char>::data(&local_250.super_buffer<char>);
    tVar2 = to_unsigned<int>(0);
    basic_string_view<char>::basic_string_view(&local_290,pcVar3,(ulong)tVar2);
    digit_grouping<char>::apply<fmt::v8::appender,char>
              (in_stack_000005a0,(appender)in_stack_000005b8.container,in_stack_000005a8);
    this = &local_250;
    pcVar3 = buffer<char>::data(&this->super_buffer<char>);
    out_00.container = (buffer<char> *)(pcVar3 + local_20);
    buffer<char>::end(&this->super_buffer<char>);
    local_8.container =
         (buffer<char> *)
         copy_str_noinline<char,char*,fmt::v8::appender>
                   ((char *)this,in_stack_fffffffffffffd18,out_00.container);
    basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer(this);
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}